

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

void BinarySink_put_ber_id_len(BinarySink *bs,int id,int length,int flags)

{
  byte bVar1;
  int iVar2;
  int local_24;
  int local_20;
  int n_1;
  int n;
  int flags_local;
  int length_local;
  int id_local;
  BinarySink *bs_local;
  
  if (id < 0x1f) {
    BinarySink_put_byte(bs->binarysink_,(byte)id | (byte)flags);
  }
  else {
    BinarySink_put_byte(bs->binarysink_,(byte)flags | 0x1f);
    local_20 = 1;
    while (0 < id >> ((char)local_20 * '\a' & 0x1fU)) {
      local_20 = local_20 + 1;
    }
    while (iVar2 = local_20 + -1, local_20 != 0) {
      bVar1 = 0;
      if (iVar2 != 0) {
        bVar1 = 0x80;
      }
      BinarySink_put_byte(bs->binarysink_,bVar1 | (byte)(id >> ((char)iVar2 * '\a' & 0x1fU)) & 0x7f)
      ;
      local_20 = iVar2;
    }
  }
  if (length < 0x80) {
    BinarySink_put_byte(bs->binarysink_,(uchar)length);
  }
  else {
    local_24 = 1;
    while (0 < length >> ((byte)(local_24 << 3) & 0x1f)) {
      local_24 = local_24 + 1;
    }
    BinarySink_put_byte(bs->binarysink_,(byte)local_24 | 0x80);
    while (local_24 != 0) {
      BinarySink_put_byte(bs->binarysink_,(uchar)(length >> ((char)(local_24 + -1) * '\b' & 0x1fU)))
      ;
      local_24 = local_24 + -1;
    }
  }
  return;
}

Assistant:

static void BinarySink_put_ber_id_len(BinarySink *bs,
                                      int id, int length, int flags)
{
    if (id <= 30) {
        /*
         * Identifier is one byte.
         */
        put_byte(bs, id | flags);
    } else {
        int n;
        /*
         * Identifier is multiple bytes: the first byte is 11111
         * plus the flags, and subsequent bytes encode the value of
         * the identifier, 7 bits at a time, with the top bit of
         * each byte 1 except the last one which is 0.
         */
        put_byte(bs, 0x1F | flags);
        for (n = 1; (id >> (7*n)) > 0; n++)
            continue;                  /* count the bytes */
        while (n--)
            put_byte(bs, (n ? 0x80 : 0) | ((id >> (7*n)) & 0x7F));
    }

    if (length < 128) {
        /*
         * Length is one byte.
         */
        put_byte(bs, length);
    } else {
        int n;
        /*
         * Length is multiple bytes. The first is 0x80 plus the
         * number of subsequent bytes, and the subsequent bytes
         * encode the actual length.
         */
        for (n = 1; (length >> (8*n)) > 0; n++)
            continue;                  /* count the bytes */
        put_byte(bs, 0x80 | n);
        while (n--)
            put_byte(bs, (length >> (8*n)) & 0xFF);
    }
}